

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

CECoordinates * __thiscall
CECoordinates::GetObservedCoords
          (CECoordinates *__return_storage_ptr__,CECoordinates *this,double *julian_date,
          double *longitude,double *latitude,double *elevation_m,double *pressure_hPa,
          double *temperature_celsius,double *relative_humidity,double *dut1,double *xp,double *yp,
          double *wavelength)

{
  double *pdVar1;
  double *hour_angle;
  double dVar2;
  double dVar3;
  double azimuth;
  double observed2;
  double observed1;
  double observed3;
  double local_80;
  CECoordinates local_78;
  CEAngle local_48;
  CECoordinateType local_34;
  
  local_78._vptr_CECoordinates = (_func_int **)0x0;
  local_80 = 0.0;
  local_78.xcoord_.angle_ = 0.0;
  local_78.xcoord_._vptr_CEAngle = (_func_int **)0x0;
  local_78.ycoord_._vptr_CEAngle = (_func_int **)0x0;
  switch(this->coord_type_) {
  case CIRS:
    pdVar1 = elevation_m;
    dVar2 = CEAngle::operator_cast_to_double(&this->xcoord_);
    dVar3 = CEAngle::operator_cast_to_double(&this->ycoord_);
    CIRS2Observed(&local_78,dVar2,dVar3,&local_80,&local_78.xcoord_.angle_,*julian_date,*longitude,
                  *latitude,*elevation_m,*pressure_hPa,*temperature_celsius,*relative_humidity,*dut1
                  ,*xp,*yp,*wavelength,(double *)&local_78.xcoord_,(double *)&local_78.ycoord_,
                  pdVar1);
    break;
  case ICRS:
    pdVar1 = elevation_m;
    dVar2 = CEAngle::operator_cast_to_double(&this->xcoord_);
    dVar3 = CEAngle::operator_cast_to_double(&this->ycoord_);
    ICRS2Observed(&local_78,dVar2,dVar3,&local_80,&local_78.xcoord_.angle_,*julian_date,*longitude,
                  *latitude,*elevation_m,*pressure_hPa,*temperature_celsius,*relative_humidity,*dut1
                  ,*xp,*yp,*wavelength,(double *)&local_78.xcoord_,(double *)&local_78.ycoord_,
                  pdVar1);
    break;
  case GALACTIC:
    pdVar1 = latitude;
    hour_angle = elevation_m;
    dVar2 = CEAngle::operator_cast_to_double(&this->xcoord_);
    dVar3 = CEAngle::operator_cast_to_double(&this->ycoord_);
    Galactic2Observed(&local_78,dVar2,dVar3,&local_80,&local_78.xcoord_.angle_,*julian_date,
                      *longitude,*latitude,*elevation_m,*pressure_hPa,*temperature_celsius,
                      *relative_humidity,*dut1,*xp,*yp,*wavelength,(double *)&local_78.xcoord_,
                      pdVar1,hour_angle);
    break;
  case OBSERVED:
    local_78._vptr_CECoordinates = (_func_int **)CEAngle::operator_cast_to_double(&this->xcoord_);
    local_80 = CEAngle::operator_cast_to_double(&this->ycoord_);
  }
  CEAngle::CEAngle(&local_48,(double *)&local_78);
  CEAngle::CEAngle((CEAngle *)&local_78.ycoord_.angle_,&local_80);
  local_34 = OBSERVED;
  CECoordinates(__return_storage_ptr__,&local_48,(CEAngle *)&local_78.ycoord_.angle_,&local_34);
  CEAngle::~CEAngle((CEAngle *)&local_78.ycoord_.angle_);
  CEAngle::~CEAngle(&local_48);
  return __return_storage_ptr__;
}

Assistant:

CECoordinates CECoordinates::GetObservedCoords(const double& julian_date,
                                const double& longitude,
                                const double& latitude,
                                const double& elevation_m,
                                const double& pressure_hPa,
                                const double& temperature_celsius,
                                const double& relative_humidity,
                                const double& dut1,
                                const double& xp, const double& yp,
                                const double& wavelength) const
{
    // Preliminary variables
    double azimuth(0);
    double zenith(0);
    double observed1(0);
    double observed2(0);
    double observed3(0);
    
    if (coord_type_ == CECoordinateType::CIRS) {
        // Convert CIRS to Observed
        CIRS2Observed(xcoord_, ycoord_, &azimuth, &zenith,
                      julian_date, longitude, latitude,
                      elevation_m, pressure_hPa, temperature_celsius,
                      relative_humidity, dut1, xp, yp, wavelength,
                      &observed1, &observed2, &observed3) ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        // Convert ICRS to Observed
        ICRS2Observed(xcoord_, ycoord_, &azimuth, &zenith,
                      julian_date, longitude, latitude,
                      elevation_m, pressure_hPa, temperature_celsius,
                      relative_humidity, dut1, xp, yp, wavelength,
                      &observed1, &observed2, &observed3) ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        // Convert Galactic to Observed
        Galactic2Observed(xcoord_, ycoord_, &azimuth, &zenith,
                          julian_date, longitude, latitude,
                          elevation_m, pressure_hPa, temperature_celsius,
                          relative_humidity, dut1, xp, yp, wavelength,
                          &observed1, &observed2, &observed3) ;
    } else if (coord_type_ == CECoordinateType::OBSERVED) {
        azimuth = xcoord_;
        zenith  = ycoord_; 
    }
    
    // Create the CECoordinates object to be returned
    return CECoordinates(azimuth, zenith, CECoordinateType::OBSERVED) ;
}